

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O2

int BN_mod_exp2_mont(BIGNUM *r,BIGNUM *a1,BIGNUM *p1,BIGNUM *a2,BIGNUM *p2,BIGNUM *m,BN_CTX *ctx,
                    BN_MONT_CTX *m_ctx)

{
  int iVar1;
  BN_MONT_CTX *__p;
  BIGNUM *r_00;
  uint uVar2;
  UniquePtr<BIGNUM> tmp;
  __uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter> local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  _Head_base<0UL,_bignum_st_*,_false> local_38;
  
  local_50._M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
       (tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>)0x0;
  if (m_ctx == (BN_MONT_CTX *)0x0) {
    __p = BN_MONT_CTX_new_for_modulus((BIGNUM *)m,(BN_CTX *)ctx);
    std::__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>::reset(&local_50,__p);
    m_ctx = (BN_MONT_CTX *)
            local_50._M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl;
    if (local_50._M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
        (_Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>)0x0) {
      uVar2 = 0;
      goto LAB_0020a561;
    }
  }
  local_48 = a2;
  local_40 = p2;
  r_00 = BN_new();
  uVar2 = 0;
  local_38._M_head_impl = (bignum_st *)r_00;
  if (r_00 != (BIGNUM *)0x0) {
    iVar1 = BN_mod_exp_mont(r,a1,p1,m,ctx,m_ctx);
    if (iVar1 != 0) {
      iVar1 = BN_mod_exp_mont(r_00,local_48,local_40,m,ctx,m_ctx);
      if (iVar1 != 0) {
        iVar1 = BN_to_montgomery((BIGNUM *)r,(BIGNUM *)r,(BN_MONT_CTX *)m_ctx,(BN_CTX *)ctx);
        uVar2 = 0;
        if (iVar1 != 0) {
          iVar1 = BN_mod_mul_montgomery(r,r,r_00,m_ctx,ctx);
          uVar2 = (uint)(iVar1 != 0);
        }
      }
    }
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
LAB_0020a561:
  std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&local_50);
  return uVar2;
}

Assistant:

int BN_mod_exp2_mont(BIGNUM *rr, const BIGNUM *a1, const BIGNUM *p1,
                     const BIGNUM *a2, const BIGNUM *p2, const BIGNUM *m,
                     BN_CTX *ctx, const BN_MONT_CTX *mont) {
  // Allocate a montgomery context if it was not supplied by the caller.
  bssl::UniquePtr<BN_MONT_CTX> new_mont;
  if (mont == nullptr) {
    new_mont.reset(BN_MONT_CTX_new_for_modulus(m, ctx));
    if (new_mont == nullptr) {
      return 0;
    }
    mont = new_mont.get();
  }

  // BN_mod_mul_montgomery removes one Montgomery factor, so passing one
  // Montgomery-encoded and one non-Montgomery-encoded value gives a
  // non-Montgomery-encoded result.
  bssl::UniquePtr<BIGNUM> tmp(BN_new());
  if (tmp == nullptr ||  //
      !BN_mod_exp_mont(rr, a1, p1, m, ctx, mont) ||
      !BN_mod_exp_mont(tmp.get(), a2, p2, m, ctx, mont) ||
      !BN_to_montgomery(rr, rr, mont, ctx) ||
      !BN_mod_mul_montgomery(rr, rr, tmp.get(), mont, ctx)) {
    return 0;
  }

  return 1;
}